

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string errstring_1;
  undefined1 local_148 [8];
  string errstring;
  mode_t *local_120;
  mode_t *default_dir_mode;
  undefined1 local_110 [4];
  mode_t default_dir_mode_v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string message;
  string local_a8;
  uint local_84;
  undefined4 local_80;
  int relative;
  int skip;
  char ch3;
  char ch2;
  char ch1;
  string sdestdir;
  allocator<char> local_41;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *destination;
  cmFileInstaller *this_local;
  
  local_20 = &(this->super_cmFileCopier).Destination;
  destination = (string *)this;
  uVar4 = std::__cxx11::string::size();
  if ((uVar4 < 2) && (bVar2 = std::operator!=(local_20,"/"), bVar2)) {
    pcVar1 = (this->super_cmFileCopier).Status;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "called with inappropriate arguments. No DESTINATION provided or .",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_006a4de1;
  }
  std::__cxx11::string::string((string *)&skip);
  bVar2 = cmsys::SystemTools::GetEnv("DESTDIR",(string *)&skip);
  if ((bVar2) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&skip);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    relative._3_1_ = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    relative._2_1_ = *pcVar5;
    relative._1_1_ = '\0';
    uVar4 = std::__cxx11::string::size();
    if (2 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
      relative._1_1_ = *pcVar5;
    }
    local_80 = 0;
    if (relative._3_1_ == '/') {
      if (relative._2_1_ != '/') goto LAB_006a4ad2;
      cmStrCat<char_const(&)[165],std::__cxx11::string&>
                ((string *)local_d0,
                 (char (*) [165])
                 "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
                 ,local_20);
      cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_d0);
      this_local._7_1_ = 0;
      message.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_d0);
    }
    else {
      if ((((relative._3_1_ < 'a') || ('z' < relative._3_1_)) &&
          ((relative._3_1_ < 'A' || ('Z' < relative._3_1_)))) || (relative._2_1_ != ':')) {
        local_84 = 1;
      }
      else {
        local_80 = 2;
        local_84 = (uint)(relative._1_1_ != '/');
      }
      if (local_84 == 0) {
LAB_006a4ad2:
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_20);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skip,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110);
        std::__cxx11::string::operator=((string *)local_20,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)local_110);
        iVar3 = std::__cxx11::string::size();
        this->DestDirLength = iVar3;
        goto LAB_006a4b68;
      }
      pcVar1 = (this->super_cmFileCopier).Status;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                 ,(allocator<char> *)(message.field_2._M_local_buf + 0xf));
      cmExecutionStatus::SetError(pcVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
      message.field_2._8_4_ = 1;
    }
  }
  else {
LAB_006a4b68:
    default_dir_mode._4_4_ = 0;
    local_120 = (mode_t *)((long)&default_dir_mode + 4);
    bVar2 = cmFileCopier::GetDefaultDirectoryPermissions(&this->super_cmFileCopier,&local_120);
    if (bVar2) {
      if (*(int *)&(this->super_cmFileCopier).field_0xf4 != 6) {
        bVar2 = cmsys::SystemTools::FileExists(local_20);
        if (!bVar2) {
          errstring.field_2._8_8_ = cmsys::SystemTools::MakeDirectory(local_20,local_120);
          bVar2 = cmsys::Status::operator_cast_to_bool((Status *)((long)&errstring.field_2 + 8));
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&errstring_1.field_2 + 8),"cannot create directory: ",local_20);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&errstring_1.field_2 + 8),
                           ". Maybe need administrative privileges.");
            std::__cxx11::string::~string((string *)(errstring_1.field_2._M_local_buf + 8));
            cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_148);
            this_local._7_1_ = 0;
            message.field_2._8_4_ = 1;
            std::__cxx11::string::~string((string *)local_148);
            goto LAB_006a4dcb;
          }
        }
        bVar2 = cmsys::SystemTools::FileIsDirectory(local_20);
        if (!bVar2) {
          std::operator+(&local_1a8,"INSTALL destination: ",local_20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188,&local_1a8," is not a directory.");
          std::__cxx11::string::~string((string *)&local_1a8);
          cmExecutionStatus::SetError((this->super_cmFileCopier).Status,(string *)local_188);
          this_local._7_1_ = 0;
          message.field_2._8_4_ = 1;
          std::__cxx11::string::~string((string *)local_188);
          goto LAB_006a4dcb;
        }
      }
      this_local._7_1_ = 1;
      message.field_2._8_4_ = 1;
    }
    else {
      this_local._7_1_ = 0;
      message.field_2._8_4_ = 1;
    }
  }
LAB_006a4dcb:
  std::__cxx11::string::~string((string *)&skip);
LAB_006a4de1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if (destination.size() < 2 && destination != "/") {
    this->Status.SetError("called with inappropriate arguments. "
                          "No DESTINATION provided or .");
    return false;
  }

  std::string sdestdir;
  if (cmSystemTools::GetEnv("DESTDIR", sdestdir) && !sdestdir.empty()) {
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if (destination.size() > 2) {
      ch3 = destination[2];
    }
    int skip = 0;
    if (ch1 != '/') {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
          ch2 == ':') {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if (ch3 != '/') {
          relative = 1;
        }
      } else {
        relative = 1;
      }
      if (relative) {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->Status.SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
      }
    } else {
      if (ch2 == '/') {
        // looks like a network path.
        std::string message =
          cmStrCat("called with network path DESTINATION. This "
                   "does not make sense when using DESTDIR. Specify local "
                   "absolute path or remove DESTDIR environment variable."
                   "\nDESTINATION=\n",
                   destination);
        this->Status.SetError(message);
        return false;
      }
    }
    destination = sdestdir + destination.substr(skip);
    this->DestDirLength = static_cast<int>(sdestdir.size());
  }

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  if (this->InstallType != cmInstallType_DIRECTORY) {
    if (!cmSystemTools::FileExists(destination)) {
      if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->Status.SetError(errstring);
        return false;
      }
    }
    if (!cmSystemTools::FileIsDirectory(destination)) {
      std::string errstring =
        "INSTALL destination: " + destination + " is not a directory.";
      this->Status.SetError(errstring);
      return false;
    }
  }
  return true;
}